

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# appender.cpp
# Opt level: O3

void __thiscall
duckdb::BaseAppender::AppendValueInternal<signed_char,long>
          (BaseAppender *this,Vector *col,char input)

{
  bool bVar1;
  InvalidInputException *this_00;
  char input_00;
  long result;
  int64_t local_40;
  string local_38;
  
  bVar1 = TryCast::Operation<signed_char,long>(input,&local_40,false);
  if (bVar1) {
    *(int64_t *)(col->data + (this->chunk).count * 8) = local_40;
    return;
  }
  this_00 = (InvalidInputException *)__cxa_allocate_exception(0x10);
  CastExceptionText<signed_char,long>(&local_38,(duckdb *)(ulong)(uint)(int)input,input_00);
  InvalidInputException::InvalidInputException(this_00,&local_38);
  __cxa_throw(this_00,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void BaseAppender::AppendValueInternal(Vector &col, SRC input) {
	FlatVector::GetData<DST>(col)[chunk.size()] = Cast::Operation<SRC, DST>(input);
}